

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWindowsRegistry.cxx
# Opt level: O3

optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmWindowsRegistry::ExpandExpression_abi_cxx11_
          (optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmWindowsRegistry *this,string_view expression,View view,
          string_view separator)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  char *pcVar5;
  undefined4 in_register_00000084;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_1b1;
  size_type local_1b0;
  ulong local_1a8;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  long *local_178 [2];
  long local_168 [2];
  size_type local_158;
  char *local_150;
  RegularExpression local_148;
  long local_78;
  long lStack_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  ulong local_58;
  char *pcStack_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pcVar5 = expression._M_str;
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,pcVar5,pcVar5 + expression._M_len,pcVar5,
             CONCAT44(in_register_00000084,view));
  local_158 = 1;
  local_150 = ";";
  local_148.regmust = (char *)0x0;
  local_148.program = (char *)0x0;
  local_148.progsize = 0;
  memset(&local_148,0,0xaa);
  cmsys::RegularExpression::compile
            (&local_148,
             "\\[({.+})?(HKCU|HKEY_CURRENT_USER|HKLM|HKEY_LOCAL_MACHINE|HKCR|HKEY_CLASSES_ROOT|HKCC|HKEY_CURRENT_CONFIG|HKU|HKEY_USERS)[/\\]?([^]]*)\\]"
            );
  local_58 = 0;
  pcStack_50 = (char *)0x0;
  local_68._M_len = 0;
  local_68._M_str = (char *)0x0;
  local_78 = 0;
  lStack_70 = 0;
  bVar1 = cmsys::RegularExpression::find(&local_148,(char *)local_178[0],&local_148.regmatch);
  if (bVar1) {
    lVar6 = (long)local_148.regmatch.endp[1] - (long)local_148.regmatch.startp[1];
    pcVar5 = local_150;
    uVar7 = local_158;
    if (lVar6 != 0) {
      uVar7 = lVar6 - 1U;
      if (lVar6 - 2U <= lVar6 - 1U) {
        uVar7 = lVar6 - 2U;
      }
      pcVar5 = (char *)((long)local_178[0] +
                       (long)(local_148.regmatch.startp[1] +
                             (1 - (long)local_148.regmatch.searchstring)));
    }
    local_78 = (long)local_148.regmatch.endp[2] - (long)local_148.regmatch.startp[2];
    lStack_70 = (long)local_178[0] +
                ((long)local_148.regmatch.startp[2] - (long)local_148.regmatch.searchstring);
    local_68._M_len = (long)local_148.regmatch.endp[3] - (long)local_148.regmatch.startp[3];
    local_68._M_str =
         (char *)((long)local_178[0] +
                 ((long)local_148.regmatch.startp[3] - (long)local_148.regmatch.searchstring));
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_68,pcVar5,0,uVar7);
    if (sVar3 == 0xffffffffffffffff) {
      local_58 = 0;
      pcStack_50 = "";
    }
    else {
      uVar7 = uVar7 + sVar3;
      if (local_68._M_len < uVar7) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar7);
      }
      pcVar5 = local_68._M_str + uVar7;
      local_58 = local_68._M_len - uVar7;
      iVar8 = (int)local_58;
      pcStack_50 = pcVar5;
      if (local_58 == 0) {
        iVar9 = iVar8 + -9;
        uVar4 = local_68._M_len;
      }
      else {
        local_1a8 = local_68._M_len;
        uVar7 = 9;
        if (local_58 < 9) {
          uVar7 = local_58;
        }
        lVar6 = 0;
        local_1b0 = sVar3;
        local_1a0 = __return_storage_ptr__;
        do {
          iVar9 = tolower((int)pcVar5[lVar6]);
          iVar2 = tolower((int)"(default)"[lVar6]);
          iVar9 = iVar9 - iVar2;
          sVar3 = local_1b0;
          uVar4 = local_1a8;
          __return_storage_ptr__ = local_1a0;
          if (iVar9 != 0) goto LAB_0052924b;
          lVar6 = lVar6 + 1;
        } while (uVar7 + (uVar7 == 0) != lVar6);
        iVar9 = iVar8 + -9;
      }
LAB_0052924b:
      if (iVar9 == 0) {
        local_58 = 0;
        pcStack_50 = "";
      }
      local_68._M_len = sVar3;
      if (uVar4 < sVar3) {
        local_68._M_len = uVar4;
      }
    }
    (__return_storage_ptr__->
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_engaged = false;
  }
  else {
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_198,pcVar5,pcVar5 + expression._M_len);
    __l._M_len = 1;
    __l._M_array = &local_198;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,__l,&local_1b1);
    *(pointer *)
     &(__return_storage_ptr__->
      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_payload._M_value.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl + 8) =
         local_48.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl + 0x10) =
         local_48.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_engaged = true;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_148.program != (char *)0x0) {
    operator_delete__(local_148.program);
  }
  if (local_178[0] != local_168) {
    operator_delete(local_178[0],local_168[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<std::vector<std::string>> cmWindowsRegistry::ExpandExpression(
  cm::string_view expression, View view, cm::string_view separator)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  static std::string NOTFOUND{ "/REGISTRY-NOTFOUND" };

  this->LastError.clear();

  // compute list of registry views
  auto views = this->ComputeViews(view);
  std::vector<std::string> result;

  for (auto v : views) {
    ExpressionParser parser(expression);

    while (parser.Find()) {
      try {
        auto handler =
          KeyHandler::OpenKey(parser.GetRootKey(), parser.GetSubKey(), v);
        auto data = handler.ReadValue(parser.GetValueName(),
                                      this->SupportedTypes, separator);
        parser.Replace(data);
      } catch (const registry_error& e) {
        this->LastError = e.what();
        parser.Replace(NOTFOUND);
        continue;
      }
    }
    result.emplace_back(parser.GetExpression());
    if (expression == parser.GetExpression()) {
      // there no substitutions, so can ignore other views
      break;
    }
  }

  return result;
#else
  (void)view;
  (void)separator;

  ExpressionParser parser(expression);
  if (parser.Find()) {
    // expression holds unsupported registry access
    // so the expression cannot be used on this platform
    return cm::nullopt;
  }
  return std::vector<std::string>{ std::string{ expression } };
#endif
}